

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

hugeint_t __thiscall
duckdb::Interpolator<true>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
          (Interpolator<true> *this,hugeint_t *v_t,Vector *result,
          QuantileDirect<duckdb::hugeint_t> *accessor)

{
  hugeint_t *in_RCX;
  RESULT_TYPE RVar1;
  hugeint_t hVar2;
  QuantileDirect<duckdb::hugeint_t> *in_stack_00000008;
  hugeint_t *in_stack_00000010;
  
  RVar1 = InterpolateInternal<duckdb::hugeint_t,duckdb::QuantileDirect<duckdb::hugeint_t>>
                    ((Interpolator<true> *)accessor,in_stack_00000010,in_stack_00000008);
  hVar2 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>(in_RCX,(Vector *)RVar1.upper)
  ;
  return hVar2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}